

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3InitVtab(int isCreate,sqlite3 *db,void *pAux,int argc,char **argv,sqlite3_vtab **ppVTab,
                char **pzErr)

{
  Fts3Index *pFVar1;
  Fts3Table *pFVar2;
  sqlite3_stmt *pStmt_00;
  char **ppcVar3;
  void *pvVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  char *p;
  size_t sVar8;
  size_t sVar9;
  byte *pbVar10;
  undefined8 *puVar11;
  char *pcVar12;
  Fts3Table *pFVar13;
  char *pcVar14;
  long lVar15;
  byte *p_00;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  u64 uVar19;
  byte *pbVar20;
  byte *pbVar21;
  byte bVar22;
  char *pcVar23;
  undefined8 *__dest;
  uint uVar24;
  int *piVar25;
  Fts3Hash *p_01;
  Vdbe *pVm;
  ulong uVar26;
  ulong uVar27;
  byte *p_02;
  bool bVar28;
  undefined1 uVar29;
  sqlite3_stmt *pStmt;
  sqlite3_tokenizer *pTokenizer;
  uint local_e4;
  char local_dd;
  uint local_dc;
  byte *local_d8;
  char *local_d0;
  Fts3Table *local_c8;
  sqlite3_stmt *local_c0;
  byte *local_b8;
  byte *local_b0;
  char **local_a8;
  ulong local_a0;
  byte *local_98;
  byte *local_90;
  Fts3Hash *local_88;
  undefined8 *local_80;
  uint local_74;
  sqlite3_tokenizer *local_70;
  ulong local_68;
  int local_5c;
  size_t local_58;
  sqlite3 *local_50;
  void *local_48;
  size_t local_40;
  sqlite3_vtab **local_38;
  
  pbVar10 = (byte *)(ulong)(uint)argc;
  local_e4 = 0;
  local_dd = (*argv)[3];
  local_70 = (sqlite3_tokenizer *)0x0;
  local_88 = (Fts3Hash *)pAux;
  local_5c = isCreate;
  local_50 = db;
  local_38 = ppVTab;
  sVar8 = strlen(argv[1]);
  local_58 = strlen(argv[2]);
  uVar19 = (long)argc * 8 - 0x10;
  iVar5 = sqlite3_initialize();
  if (iVar5 == 0) {
    puVar11 = (undefined8 *)sqlite3Malloc(uVar19);
  }
  else {
    puVar11 = (undefined8 *)0x0;
  }
  if (puVar11 == (undefined8 *)0x0) {
LAB_001bad46:
    local_48 = (void *)0x0;
  }
  else {
    memset(puVar11,0,uVar19);
    iVar5 = sqlite3_initialize();
    if (iVar5 != 0) goto LAB_001bad46;
    local_48 = sqlite3Malloc(uVar19);
  }
  if (local_48 != (void *)0x0) {
    memset(local_48,0,uVar19);
  }
  local_80 = puVar11;
  if (puVar11 == (undefined8 *)0x0 || local_48 == (void *)0x0) {
    local_e4 = 7;
    local_c8 = (Fts3Table *)0x0;
    p_00 = (byte *)0x0;
    pbVar10 = (byte *)0x0;
    pbVar20 = (byte *)0x0;
    pbVar21 = (byte *)0x0;
    p_01 = (Fts3Hash *)0x0;
    p_02 = (byte *)0x0;
    uVar16 = 0;
    goto LAB_001bbd6b;
  }
  bVar28 = local_e4 == 0;
  local_a8 = argv;
  local_40 = sVar8;
  if (argc < 4 || !bVar28) {
    uVar29 = true;
    local_c8 = (Fts3Table *)0x0;
    local_d0 = (char *)0x0;
    local_74 = 0;
    p_00 = (byte *)0x0;
    local_d8 = (byte *)0x0;
    local_b8 = (byte *)0x0;
    pbVar20 = (byte *)0x0;
    pbVar21 = (byte *)0x0;
    local_dc = 0;
  }
  else {
    local_a0 = (ulong)(uint)argc;
    uVar17 = 3;
    local_68 = local_68 & 0xffffffff00000000;
    local_dc = 0;
    local_98 = (byte *)0x0;
    local_b0 = (byte *)0x0;
    local_b8 = (byte *)0x0;
    local_d8 = (byte *)0x0;
    local_90 = (byte *)0x0;
    local_74 = 0;
    local_d0 = (char *)0x0;
    local_c8 = (Fts3Table *)0x0;
    do {
      pcVar12 = argv[uVar17];
      if ((((local_70 == (sqlite3_tokenizer *)0x0) && (sVar9 = strlen(pcVar12), 8 < sVar9)) &&
          (iVar5 = sqlite3_strnicmp(pcVar12,"tokenize",8), iVar5 == 0)) &&
         ((-1 < (long)pcVar12[8] && (sqlite3Fts3IsIdChar_isFtsIdChar[pcVar12[8]] == '\0')))) {
        local_e4 = sqlite3Fts3InitTokenizer(local_88,pcVar12 + 9,&local_70,pzErr);
      }
      else {
        if (local_dd == '4') {
          for (uVar26 = 0; pcVar12[uVar26] != '\0'; uVar26 = uVar26 + 1) {
            if (pcVar12[uVar26] == '=') {
              pbVar10 = (byte *)sqlite3_mprintf("%s");
              if (pbVar10 != (byte *)0x0) {
                sqlite3Fts3Dequote((char *)pbVar10);
              }
              bVar28 = false;
              sVar8 = uVar26 & 0xffffffff;
              goto LAB_001bae9b;
            }
          }
          bVar28 = true;
LAB_001bae9b:
          argv = local_a8;
          if (!bVar28) {
            if (pbVar10 == (byte *)0x0) {
              local_e4 = 7;
              goto LAB_001baecd;
            }
            piVar25 = &DAT_0020d968;
            uVar26 = 0;
            do {
              if (((int)sVar8 == *piVar25) &&
                 (iVar5 = sqlite3_strnicmp(pcVar12,*(char **)(piVar25 + -2),*piVar25), iVar5 == 0))
              goto LAB_001baf2c;
              uVar26 = uVar26 + 1;
              piVar25 = piVar25 + 4;
            } while (uVar26 != 8);
            uVar26 = 8;
LAB_001baf2c:
            puVar11 = local_80;
            pbVar20 = pbVar10;
            switch(uVar26 & 0xffffffff) {
            case 0:
              sVar9 = strlen((char *)pbVar10);
              argv = local_a8;
              if ((sVar9 != 4) || (iVar5 = sqlite3_strnicmp((char *)pbVar10,"fts3",4), iVar5 != 0))
              {
                sqlite3Fts3ErrMsg(pzErr,"unrecognized matchinfo: %s",pbVar10);
                local_e4 = 1;
              }
              local_68 = CONCAT44(local_68._4_4_,1);
              break;
            case 1:
              sqlite3_free(local_90);
              pbVar20 = (byte *)0x0;
              argv = local_a8;
              local_90 = pbVar10;
              break;
            case 2:
              sqlite3_free(local_d8);
              pbVar20 = (byte *)0x0;
              argv = local_a8;
              local_d8 = pbVar10;
              break;
            case 3:
              sqlite3_free(local_b8);
              pbVar20 = (byte *)0x0;
              argv = local_a8;
              local_b8 = pbVar10;
              break;
            case 4:
              sVar9 = strlen((char *)pbVar10);
              argv = local_a8;
              if (sVar9 == 4) {
                iVar5 = sqlite3_strnicmp((char *)pbVar10,"desc",4);
joined_r0x001bb056:
                if (iVar5 != 0) goto LAB_001bb058;
              }
              else {
                if (sVar9 == 3) {
                  iVar5 = sqlite3_strnicmp((char *)pbVar10,"asc",3);
                  goto joined_r0x001bb056;
                }
LAB_001bb058:
                sqlite3Fts3ErrMsg(pzErr,"unrecognized order: %s",pbVar10);
                local_e4 = 1;
              }
              local_74 = (uint)((*pbVar10 & 0xdf) == 0x44);
              break;
            case 5:
              sqlite3_free(local_b0);
              pbVar20 = (byte *)0x0;
              argv = local_a8;
              local_b0 = pbVar10;
              break;
            case 6:
              sqlite3_free(local_98);
              pbVar20 = (byte *)0x0;
              argv = local_a8;
              local_98 = pbVar10;
              break;
            case 7:
              lVar18 = (long)(int)local_dc;
              local_dc = local_dc + 1;
              *(byte **)((long)local_48 + lVar18 * 8) = pbVar10;
              pbVar20 = (byte *)0x0;
              argv = local_a8;
              break;
            default:
              sqlite3Fts3ErrMsg(pzErr,"unrecognized parameter: %s",pcVar12);
              local_e4 = 1;
              argv = local_a8;
            }
            pbVar10 = pbVar20;
            sqlite3_free(pbVar10);
            goto LAB_001baecd;
          }
        }
        sVar9 = strlen(pcVar12);
        local_c8 = (Fts3Table *)(ulong)((int)local_c8 + (int)sVar9 + 1);
        iVar5 = (int)local_d0;
        local_d0 = (char *)(ulong)(iVar5 + 1);
        puVar11[iVar5] = pcVar12;
      }
LAB_001baecd:
      bVar28 = local_e4 == 0;
    } while ((bVar28) && (uVar17 = uVar17 + 1, uVar17 < local_a0));
    uVar29 = (int)local_68 == 0;
    p_00 = local_90;
    pbVar20 = local_b0;
    pbVar21 = local_98;
  }
  pcVar12 = local_d0;
  if ((bVar28) && (pbVar20 != (byte *)0x0)) {
    local_a0 = CONCAT71(local_a0._1_7_,uVar29);
    sqlite3_free(local_d8);
    sqlite3_free(local_b8);
    pcVar12 = local_d0;
    if ((int)local_d0 == 0) {
      sqlite3_free(puVar11);
      local_c0 = (sqlite3_stmt *)0x0;
      local_b0 = pbVar20;
      pcVar12 = sqlite3_mprintf("SELECT * FROM %Q.%Q",argv[1],pbVar20);
      if (pcVar12 == (char *)0x0) {
        uVar16 = 7;
      }
      else {
        uVar6 = sqlite3LockAndPrepare(local_50,pcVar12,-1,0,(Vdbe *)0x0,&local_c0,(char **)0x0);
        uVar16 = 0;
        if (uVar6 != 0) {
          pcVar14 = sqlite3_errmsg(local_50);
          sqlite3Fts3ErrMsg(pzErr,"%s",pcVar14);
          uVar16 = uVar6;
        }
      }
      sqlite3_free(pcVar12);
      pbVar20 = local_b0;
      pStmt_00 = local_c0;
      pcVar12 = local_d0;
      if (uVar16 == 0) {
        local_d0 = (char *)((ulong)local_d0 & 0xffffffff00000000);
        if (local_c0 != (sqlite3_stmt *)0x0) {
          local_d0 = (char *)CONCAT44(SUB84(pcVar12,4),(uint)*(ushort *)(local_c0 + 0xc0));
        }
        pcVar12 = local_d0;
        iVar7 = 0;
        iVar5 = (int)local_d0;
        local_90 = p_00;
        if ((int)local_d0 == 0) {
          uVar17 = 0;
        }
        else {
          uVar17 = 0;
          do {
            pcVar14 = (char *)columnName(pStmt_00,iVar7,0,0);
            sVar8 = strlen(pcVar14);
            uVar17 = uVar17 + sVar8 + 1;
            iVar7 = iVar7 + 1;
          } while (iVar5 != iVar7);
        }
        uVar26 = (ulong)pcVar12 & 0xffffffff;
        iVar5 = sqlite3_initialize();
        local_d8 = (byte *)0x0;
        if (iVar5 == 0) {
          puVar11 = (undefined8 *)sqlite3Malloc(uVar17 + uVar26 * 8);
        }
        else {
          puVar11 = (undefined8 *)0x0;
        }
        local_d8 = (byte *)((ulong)local_d8 & 0xffffffff);
        if (puVar11 == (undefined8 *)0x0) {
          local_d8 = (byte *)0x7;
        }
        local_c8 = (Fts3Table *)uVar17;
        local_80 = puVar11;
        if (((int)local_d0 != 0) && (puVar11 != (undefined8 *)0x0)) {
          __dest = puVar11 + uVar26;
          local_d8 = (byte *)0x0;
          uVar17 = 0;
          local_98 = pbVar21;
          do {
            pcVar12 = (char *)columnName(local_c0,(int)uVar17,0,0);
            sVar8 = strlen(pcVar12);
            sVar8 = (long)((sVar8 << 0x20) + 0x100000000) >> 0x20;
            memcpy(__dest,pcVar12,sVar8);
            puVar11[uVar17] = __dest;
            __dest = (undefined8 *)((long)__dest + sVar8);
            uVar17 = uVar17 + 1;
            pbVar20 = local_b0;
            pbVar21 = local_98;
          } while (uVar26 != uVar17);
        }
        sqlite3_finalize(local_c0);
        uVar16 = (uint)local_d8;
        p_00 = local_90;
        uVar29 = (byte)local_a0;
      }
      else {
        local_80 = (undefined8 *)0x0;
        uVar29 = (byte)local_a0;
      }
      puVar11 = local_80;
      pcVar12 = (char *)((ulong)local_d0 & 0xffffffff);
      iVar5 = (int)local_d0;
      local_e4 = uVar16;
      if (((uVar16 == 0) && (pbVar21 != (byte *)0x0)) && (0 < iVar5)) {
        pcVar14 = (char *)0x0;
LAB_001bb451:
        if (((char *)puVar11[(long)pcVar14] == (char *)0x0) ||
           (iVar7 = sqlite3StrICmp((char *)pbVar21,(char *)puVar11[(long)pcVar14]), iVar7 != 0))
        goto LAB_001bb46c;
        if ((int)pcVar14 < iVar5) {
          do {
            puVar11[(long)pcVar14] = puVar11[(long)(pcVar14 + 1)];
            pcVar14 = pcVar14 + 1;
          } while (pcVar12 != pcVar14);
        }
        pcVar12 = (char *)(ulong)(iVar5 - 1);
        pbVar20 = local_b0;
        goto LAB_001bb4c2;
      }
      local_d8 = (byte *)0x0;
      local_b8 = (byte *)0x0;
    }
    else {
LAB_001bb4c2:
      local_b8 = (byte *)0x0;
      local_d8 = (byte *)0x0;
      uVar29 = (byte)local_a0;
    }
  }
  local_80 = puVar11;
  if (local_e4 == 0) {
    if ((int)pcVar12 == 0) {
      *puVar11 = "content";
      pcVar12 = (char *)0x1;
      local_c8 = (Fts3Table *)0x8;
    }
    local_d0 = pcVar12;
    local_98 = pbVar21;
    if (local_70 == (sqlite3_tokenizer *)0x0) {
      local_e4 = sqlite3Fts3InitTokenizer(local_88,"simple",&local_70,pzErr);
      pbVar21 = local_98;
      if (local_e4 != 0) goto LAB_001bb4d3;
      local_e4 = 0;
    }
    pvVar4 = local_48;
    local_a0 = CONCAT71(local_a0._1_7_,uVar29);
    uVar16 = 1;
    if ((p_00 != (byte *)0x0) && (*p_00 != 0)) {
      uVar16 = 2;
      pbVar10 = p_00;
      do {
        if (*pbVar10 == 0x2c) {
          uVar16 = uVar16 + 1;
        }
        else if (*pbVar10 == 0) break;
        pbVar10 = pbVar10 + 1;
      } while( true );
    }
    iVar5 = sqlite3_initialize();
    if (iVar5 == 0) {
      local_88 = (Fts3Hash *)sqlite3Malloc((long)(int)uVar16 * 0x28);
    }
    else {
      local_88 = (Fts3Hash *)0x0;
    }
    local_b0 = pbVar20;
    if (local_88 == (Fts3Hash *)0x0) {
      uVar6 = 7;
      uVar16 = 0;
    }
    else {
      uVar6 = 0;
      memset(local_88,0,(long)(int)uVar16 * 0x28);
      if (p_00 != (byte *)0x0) {
        bVar28 = 1 < (int)uVar16;
        if (1 < (int)uVar16) {
          iVar5 = 1;
          pbVar10 = p_00;
          do {
            bVar22 = *pbVar10;
            iVar7 = 0;
            pbVar20 = pbVar10;
            if ((byte)(bVar22 - 0x30) < 10) {
              iVar7 = 0;
              do {
                iVar7 = (uint)(byte)(bVar22 - 0x30) + iVar7 * 10;
                if (10000000 < iVar7) {
                  iVar7 = 0;
                  break;
                }
                bVar22 = pbVar20[1];
                pbVar20 = pbVar20 + 1;
              } while ((byte)(bVar22 - 0x30) < 10);
            }
            pbVar21 = pbVar20;
            if (pbVar20 != pbVar10) {
              if (iVar7 == 0) {
                uVar16 = uVar16 - 1;
                iVar5 = iVar5 + -1;
              }
              else {
                *(int *)((long)local_88 + (long)iVar5 * 0x28) = iVar7;
              }
              pbVar21 = pbVar20 + 1;
            }
            if (pbVar20 == pbVar10) break;
            iVar5 = iVar5 + 1;
            bVar28 = iVar5 < (int)uVar16;
            pbVar10 = pbVar21;
          } while (iVar5 < (int)uVar16);
        }
        uVar24 = 0;
        if (bVar28 == false) {
          uVar24 = uVar16;
        }
        uVar6 = (uint)bVar28;
        uVar16 = uVar24;
      }
    }
    local_e4 = uVar6;
    if (uVar6 == 1) {
      sqlite3Fts3ErrMsg(pzErr,"error parsing prefix parameter: %s");
    }
    if (local_e4 == 0) {
      iVar5 = (int)local_d0;
      lVar18 = (long)iVar5;
      local_68 = (ulong)(int)uVar16;
      sVar8 = local_68 * 0x28;
      local_58 = (size_t)((int)local_58 + 1);
      sVar9 = (size_t)((int)local_40 + 1);
      uVar19 = (long)(int)local_c8 + lVar18 * 9 + sVar9 + local_58 + sVar8 + 0x208;
      local_c8 = (Fts3Table *)sVar9;
      local_90 = p_00;
      iVar7 = sqlite3_initialize();
      if (iVar7 == 0) {
        pFVar13 = (Fts3Table *)sqlite3Malloc(uVar19);
      }
      else {
        pFVar13 = (Fts3Table *)0x0;
      }
      if (pFVar13 != (Fts3Table *)0x0) {
        memset(pFVar13,0,uVar19);
        bVar28 = local_dd == '4';
        pFVar13->db = local_50;
        pFVar13->nColumn = iVar5;
        pFVar13->nPendingData = 0;
        pFVar13->azColumn = (char **)(pFVar13 + 1);
        pFVar13->pTokenizer = local_70;
        pFVar13->nMaxPendingData = 0x100000;
        pFVar13->bHasStat = bVar28;
        pFVar13->bFts4 = bVar28;
        pFVar13->bHasDocsize = bVar28 & (byte)local_a0;
        pFVar13->bDescIdx = (u8)local_74;
        pFVar13->nAutoincrmerge = 0xff;
        pFVar13->zContentTbl = (char *)local_b0;
        pFVar13->zLanguageid = (char *)local_98;
        pFVar13->aIndex = (Fts3Index *)(pFVar13[1].aStmt + lVar18 + -0xd);
        memcpy((Fts3Index *)(pFVar13[1].aStmt + lVar18 + -0xd),local_88,sVar8);
        sVar8 = local_58;
        ppcVar3 = local_a8;
        pFVar13->nIndex = uVar16;
        if (0 < (int)uVar16) {
          lVar15 = 0;
          do {
            pFVar1 = pFVar13->aIndex;
            *(undefined2 *)(&(pFVar1->hPending).keyClass + lVar15) = 0x101;
            *(undefined8 *)((long)&(pFVar1->hPending).ht + lVar15) = 0;
            puVar11 = (undefined8 *)((long)&(pFVar1->hPending).count + lVar15);
            *puVar11 = 0;
            puVar11[1] = 0;
            lVar15 = lVar15 + 0x28;
          } while ((ulong)uVar16 * 0x28 != lVar15);
        }
        pFVar13->abNotindexed = (u8 *)(pFVar13->aIndex + local_68);
        pcVar12 = (char *)((long)&pFVar13->aIndex[local_68].nPrefix + lVar18);
        pFVar13->zName = pcVar12;
        memcpy(pcVar12,local_a8[2],local_58);
        pFVar2 = local_c8;
        pcVar12 = pcVar12 + sVar8;
        pFVar13->zDb = pcVar12;
        memcpy(pcVar12,ppcVar3[1],(size_t)local_c8);
        uVar17 = (ulong)local_d0 & 0xffffffff;
        if (0 < iVar5) {
          pcVar12 = pcVar12 + (long)pFVar2;
          uVar26 = 0;
          do {
            local_c0 = (sqlite3_stmt *)((ulong)local_c0 & 0xffffffff00000000);
            pcVar14 = sqlite3Fts3NextToken((char *)local_80[uVar26],(int *)&local_c0);
            sVar8 = (size_t)(int)local_c0;
            if (0 < (long)sVar8) {
              memcpy(pcVar12,pcVar14,sVar8);
            }
            pcVar12[sVar8] = '\0';
            sqlite3Fts3Dequote(pcVar12);
            pFVar13->azColumn[uVar26] = pcVar12;
            pcVar12 = pcVar12 + sVar8 + 1;
            uVar26 = uVar26 + 1;
          } while (uVar17 != uVar26);
        }
        uVar26 = (ulong)local_dc;
        local_c8 = pFVar13;
        if (0 < (int)local_d0) {
          uVar27 = 0;
          local_a0 = uVar17;
          do {
            sVar8 = strlen(local_c8->azColumn[uVar27]);
            if (0 < (int)local_dc) {
              uVar17 = 0;
              do {
                pcVar12 = *(char **)((long)pvVar4 + uVar17 * 8);
                if (pcVar12 != (char *)0x0) {
                  sVar9 = strlen(pcVar12);
                  if (((int)sVar8 == (int)sVar9) &&
                     (iVar5 = sqlite3_strnicmp(local_c8->azColumn[uVar27],pcVar12,(int)sVar8),
                     iVar5 == 0)) {
                    local_c8->abNotindexed[uVar27] = '\x01';
                    sqlite3_free(pcVar12);
                    *(undefined8 *)((long)pvVar4 + uVar17 * 8) = 0;
                  }
                }
                uVar17 = uVar17 + 1;
              } while (uVar26 != uVar17);
            }
            uVar27 = uVar27 + 1;
          } while (uVar27 != local_a0);
        }
        pbVar10 = local_d8;
        uVar16 = local_e4;
        if (0 < (int)local_dc) {
          uVar17 = 0;
          do {
            if (*(long *)((long)pvVar4 + uVar17 * 8) != 0) {
              sqlite3Fts3ErrMsg(pzErr,"no such column: %s");
              uVar16 = 1;
            }
            uVar17 = uVar17 + 1;
          } while (uVar26 != uVar17);
        }
        local_e4 = uVar16;
        if ((uVar16 == 0) && ((local_b8 != (byte *)0x0) == (pbVar10 == (byte *)0x0))) {
          pcVar12 = "uncompress";
          if (pbVar10 == (byte *)0x0) {
            pcVar12 = "compress";
          }
          local_e4 = 1;
          sqlite3Fts3ErrMsg(pzErr,"missing %s parameter in fts4 constructor",pcVar12);
        }
        pFVar13 = local_c8;
        local_c0 = (sqlite3_stmt *)0x0;
        if (local_c8->zContentTbl == (char *)0x0) {
          if (local_b8 == (byte *)0x0) {
            pcVar14 = "";
            pcVar12 = (char *)0x0;
          }
          else {
            pcVar14 = fts3QuoteId((char *)local_b8);
            pcVar12 = pcVar14;
          }
          fts3Appendf((int *)&local_e4,(char **)&local_c0,"docid");
          if (0 < pFVar13->nColumn) {
            uVar17 = 0;
            do {
              fts3Appendf((int *)&local_e4,(char **)&local_c0,",%s(x.\'c%d%q\')",pcVar14,
                          uVar17 & 0xffffffff,pFVar13->azColumn[uVar17]);
              uVar17 = uVar17 + 1;
            } while ((long)uVar17 < (long)pFVar13->nColumn);
          }
          if (pFVar13->zLanguageid != (char *)0x0) {
            fts3Appendf((int *)&local_e4,(char **)&local_c0,", x.%Q","langid");
          }
          sqlite3_free(pcVar12);
        }
        else {
          fts3Appendf((int *)&local_e4,(char **)&local_c0,"rowid");
          if (0 < pFVar13->nColumn) {
            lVar18 = 0;
            do {
              fts3Appendf((int *)&local_e4,(char **)&local_c0,", x.\'%q\'",pFVar13->azColumn[lVar18]
                         );
              lVar18 = lVar18 + 1;
            } while (lVar18 < pFVar13->nColumn);
          }
          pbVar10 = local_d8;
          if (pFVar13->zLanguageid != (char *)0x0) {
            fts3Appendf((int *)&local_e4,(char **)&local_c0,", x.%Q");
          }
        }
        pcVar14 = "";
        pcVar12 = pFVar13->zContentTbl;
        pcVar23 = "";
        if (pcVar12 == (char *)0x0) {
          pcVar12 = pFVar13->zName;
          pcVar23 = "_content";
        }
        fts3Appendf((int *)&local_e4,(char **)&local_c0," FROM \'%q\'.\'%q%s\' AS x",pFVar13->zDb,
                    pcVar12,pcVar23);
        pFVar13->zReadExprlist = (char *)local_c0;
        local_c0 = (sqlite3_stmt *)0x0;
        if (pbVar10 == (byte *)0x0) {
          local_d0 = (char *)0x0;
        }
        else {
          pcVar14 = fts3QuoteId((char *)pbVar10);
          local_d0 = pcVar14;
        }
        fts3Appendf((int *)&local_e4,(char **)&local_c0,"?");
        if (0 < pFVar13->nColumn) {
          iVar5 = 0;
          do {
            fts3Appendf((int *)&local_e4,(char **)&local_c0,",%s(?)",pcVar14);
            iVar5 = iVar5 + 1;
          } while (iVar5 < pFVar13->nColumn);
        }
        if (pFVar13->zLanguageid != (char *)0x0) {
          fts3Appendf((int *)&local_e4,(char **)&local_c0,", ?");
        }
        sqlite3_free(local_d0);
        pbVar10 = local_d8;
        uVar16 = local_dc;
        pFVar13->zWriteExprlist = (char *)local_c0;
        if (local_e4 == 0) {
          if (local_5c != 0) {
            local_e4 = fts3CreateTables(pFVar13);
          }
          if (local_dd != '4' && local_5c == 0) {
            pFVar13->bHasStat = '\x02';
          }
          fts3DatabasePageSize((int *)&local_e4,pFVar13);
          pFVar13->nNodeSize = pFVar13->nPgsz + -0x23;
          fts3DeclareVtab((int *)&local_e4,pFVar13);
        }
        pbVar21 = (byte *)0x0;
        pbVar20 = (byte *)0x0;
        p_00 = local_90;
        p_01 = local_88;
        p_02 = local_b8;
        goto LAB_001bbd6b;
      }
      local_e4 = 7;
      p_00 = local_90;
    }
    local_c8 = (Fts3Table *)0x0;
    pbVar10 = local_d8;
    pbVar20 = local_b0;
    pbVar21 = local_98;
    p_01 = local_88;
    p_02 = local_b8;
    uVar16 = local_dc;
  }
  else {
LAB_001bb4d3:
    local_c8 = (Fts3Table *)0x0;
    pbVar10 = local_d8;
    p_01 = (Fts3Hash *)0x0;
    p_02 = local_b8;
    uVar16 = local_dc;
  }
LAB_001bbd6b:
  sqlite3_free(p_00);
  sqlite3_free(p_01);
  sqlite3_free(pbVar10);
  sqlite3_free(p_02);
  sqlite3_free(pbVar20);
  sqlite3_free(pbVar21);
  pvVar4 = local_48;
  if (0 < (int)uVar16) {
    uVar17 = 0;
    do {
      sqlite3_free(*(void **)((long)pvVar4 + uVar17 * 8));
      uVar17 = uVar17 + 1;
    } while (uVar16 != uVar17);
  }
  sqlite3_free(local_80);
  sqlite3_free(pvVar4);
  if (local_e4 == 0) {
    *local_38 = &local_c8->base;
  }
  else if (local_c8 == (Fts3Table *)0x0) {
    if (local_70 != (sqlite3_tokenizer *)0x0) {
      (*local_70->pModule->xDestroy)(local_70);
    }
  }
  else {
    fts3DisconnectMethod(&local_c8->base);
  }
  return local_e4;
LAB_001bb46c:
  pcVar14 = pcVar14 + 1;
  pbVar20 = local_b0;
  if (pcVar12 == pcVar14) goto LAB_001bb4c2;
  goto LAB_001bb451;
}

Assistant:

static int fts3InitVtab(
  int isCreate,                   /* True for xCreate, false for xConnect */
  sqlite3 *db,                    /* The SQLite database connection */
  void *pAux,                     /* Hash table containing tokenizers */
  int argc,                       /* Number of elements in argv array */
  const char * const *argv,       /* xCreate/xConnect argument array */
  sqlite3_vtab **ppVTab,          /* Write the resulting vtab structure here */
  char **pzErr                    /* Write any error message here */
){
  Fts3Hash *pHash = (Fts3Hash *)pAux;
  Fts3Table *p = 0;               /* Pointer to allocated vtab */
  int rc = SQLITE_OK;             /* Return code */
  int i;                          /* Iterator variable */
  sqlite3_int64 nByte;            /* Size of allocation used for *p */
  int iCol;                       /* Column index */
  int nString = 0;                /* Bytes required to hold all column names */
  int nCol = 0;                   /* Number of columns in the FTS table */
  char *zCsr;                     /* Space for holding column names */
  int nDb;                        /* Bytes required to hold database name */
  int nName;                      /* Bytes required to hold table name */
  int isFts4 = (argv[0][3]=='4'); /* True for FTS4, false for FTS3 */
  const char **aCol;              /* Array of column names */
  sqlite3_tokenizer *pTokenizer = 0;        /* Tokenizer for this table */

  int nIndex = 0;                 /* Size of aIndex[] array */
  struct Fts3Index *aIndex = 0;   /* Array of indexes for this table */

  /* The results of parsing supported FTS4 key=value options: */
  int bNoDocsize = 0;             /* True to omit %_docsize table */
  int bDescIdx = 0;               /* True to store descending indexes */
  char *zPrefix = 0;              /* Prefix parameter value (or NULL) */
  char *zCompress = 0;            /* compress=? parameter (or NULL) */
  char *zUncompress = 0;          /* uncompress=? parameter (or NULL) */
  char *zContent = 0;             /* content=? parameter (or NULL) */
  char *zLanguageid = 0;          /* languageid=? parameter (or NULL) */
  char **azNotindexed = 0;        /* The set of notindexed= columns */
  int nNotindexed = 0;            /* Size of azNotindexed[] array */

  assert( strlen(argv[0])==4 );
  assert( (sqlite3_strnicmp(argv[0], "fts4", 4)==0 && isFts4)
       || (sqlite3_strnicmp(argv[0], "fts3", 4)==0 && !isFts4)
  );

  nDb = (int)strlen(argv[1]) + 1;
  nName = (int)strlen(argv[2]) + 1;

  nByte = sizeof(const char *) * (argc-2);
  aCol = (const char **)sqlite3_malloc64(nByte);
  if( aCol ){
    memset((void*)aCol, 0, nByte);
    azNotindexed = (char **)sqlite3_malloc64(nByte);
  }
  if( azNotindexed ){
    memset(azNotindexed, 0, nByte);
  }
  if( !aCol || !azNotindexed ){
    rc = SQLITE_NOMEM;
    goto fts3_init_out;
  }

  /* Loop through all of the arguments passed by the user to the FTS3/4
  ** module (i.e. all the column names and special arguments). This loop
  ** does the following:
  **
  **   + Figures out the number of columns the FTSX table will have, and
  **     the number of bytes of space that must be allocated to store copies
  **     of the column names.
  **
  **   + If there is a tokenizer specification included in the arguments,
  **     initializes the tokenizer pTokenizer.
  */
  for(i=3; rc==SQLITE_OK && i<argc; i++){
    char const *z = argv[i];
    int nKey;
    char *zVal;

    /* Check if this is a tokenizer specification */
    if( !pTokenizer 
     && strlen(z)>8
     && 0==sqlite3_strnicmp(z, "tokenize", 8) 
     && 0==sqlite3Fts3IsIdChar(z[8])
    ){
      rc = sqlite3Fts3InitTokenizer(pHash, &z[9], &pTokenizer, pzErr);
    }

    /* Check if it is an FTS4 special argument. */
    else if( isFts4 && fts3IsSpecialColumn(z, &nKey, &zVal) ){
      struct Fts4Option {
        const char *zOpt;
        int nOpt;
      } aFts4Opt[] = {
        { "matchinfo",   9 },     /* 0 -> MATCHINFO */
        { "prefix",      6 },     /* 1 -> PREFIX */
        { "compress",    8 },     /* 2 -> COMPRESS */
        { "uncompress", 10 },     /* 3 -> UNCOMPRESS */
        { "order",       5 },     /* 4 -> ORDER */
        { "content",     7 },     /* 5 -> CONTENT */
        { "languageid", 10 },     /* 6 -> LANGUAGEID */
        { "notindexed", 10 }      /* 7 -> NOTINDEXED */
      };

      int iOpt;
      if( !zVal ){
        rc = SQLITE_NOMEM;
      }else{
        for(iOpt=0; iOpt<SizeofArray(aFts4Opt); iOpt++){
          struct Fts4Option *pOp = &aFts4Opt[iOpt];
          if( nKey==pOp->nOpt && !sqlite3_strnicmp(z, pOp->zOpt, pOp->nOpt) ){
            break;
          }
        }
        switch( iOpt ){
          case 0:               /* MATCHINFO */
            if( strlen(zVal)!=4 || sqlite3_strnicmp(zVal, "fts3", 4) ){
              sqlite3Fts3ErrMsg(pzErr, "unrecognized matchinfo: %s", zVal);
              rc = SQLITE_ERROR;
            }
            bNoDocsize = 1;
            break;

          case 1:               /* PREFIX */
            sqlite3_free(zPrefix);
            zPrefix = zVal;
            zVal = 0;
            break;

          case 2:               /* COMPRESS */
            sqlite3_free(zCompress);
            zCompress = zVal;
            zVal = 0;
            break;

          case 3:               /* UNCOMPRESS */
            sqlite3_free(zUncompress);
            zUncompress = zVal;
            zVal = 0;
            break;

          case 4:               /* ORDER */
            if( (strlen(zVal)!=3 || sqlite3_strnicmp(zVal, "asc", 3)) 
             && (strlen(zVal)!=4 || sqlite3_strnicmp(zVal, "desc", 4)) 
            ){
              sqlite3Fts3ErrMsg(pzErr, "unrecognized order: %s", zVal);
              rc = SQLITE_ERROR;
            }
            bDescIdx = (zVal[0]=='d' || zVal[0]=='D');
            break;

          case 5:              /* CONTENT */
            sqlite3_free(zContent);
            zContent = zVal;
            zVal = 0;
            break;

          case 6:              /* LANGUAGEID */
            assert( iOpt==6 );
            sqlite3_free(zLanguageid);
            zLanguageid = zVal;
            zVal = 0;
            break;

          case 7:              /* NOTINDEXED */
            azNotindexed[nNotindexed++] = zVal;
            zVal = 0;
            break;

          default:
            assert( iOpt==SizeofArray(aFts4Opt) );
            sqlite3Fts3ErrMsg(pzErr, "unrecognized parameter: %s", z);
            rc = SQLITE_ERROR;
            break;
        }
        sqlite3_free(zVal);
      }
    }

    /* Otherwise, the argument is a column name. */
    else {
      nString += (int)(strlen(z) + 1);
      aCol[nCol++] = z;
    }
  }

  /* If a content=xxx option was specified, the following:
  **
  **   1. Ignore any compress= and uncompress= options.
  **
  **   2. If no column names were specified as part of the CREATE VIRTUAL
  **      TABLE statement, use all columns from the content table.
  */
  if( rc==SQLITE_OK && zContent ){
    sqlite3_free(zCompress); 
    sqlite3_free(zUncompress); 
    zCompress = 0;
    zUncompress = 0;
    if( nCol==0 ){
      sqlite3_free((void*)aCol); 
      aCol = 0;
      rc = fts3ContentColumns(db, argv[1], zContent,&aCol,&nCol,&nString,pzErr);

      /* If a languageid= option was specified, remove the language id
      ** column from the aCol[] array. */ 
      if( rc==SQLITE_OK && zLanguageid ){
        int j;
        for(j=0; j<nCol; j++){
          if( sqlite3_stricmp(zLanguageid, aCol[j])==0 ){
            int k;
            for(k=j; k<nCol; k++) aCol[k] = aCol[k+1];
            nCol--;
            break;
          }
        }
      }
    }
  }
  if( rc!=SQLITE_OK ) goto fts3_init_out;

  if( nCol==0 ){
    assert( nString==0 );
    aCol[0] = "content";
    nString = 8;
    nCol = 1;
  }

  if( pTokenizer==0 ){
    rc = sqlite3Fts3InitTokenizer(pHash, "simple", &pTokenizer, pzErr);
    if( rc!=SQLITE_OK ) goto fts3_init_out;
  }
  assert( pTokenizer );

  rc = fts3PrefixParameter(zPrefix, &nIndex, &aIndex);
  if( rc==SQLITE_ERROR ){
    assert( zPrefix );
    sqlite3Fts3ErrMsg(pzErr, "error parsing prefix parameter: %s", zPrefix);
  }
  if( rc!=SQLITE_OK ) goto fts3_init_out;

  /* Allocate and populate the Fts3Table structure. */
  nByte = sizeof(Fts3Table) +                  /* Fts3Table */
          nCol * sizeof(char *) +              /* azColumn */
          nIndex * sizeof(struct Fts3Index) +  /* aIndex */
          nCol * sizeof(u8) +                  /* abNotindexed */
          nName +                              /* zName */
          nDb +                                /* zDb */
          nString;                             /* Space for azColumn strings */
  p = (Fts3Table*)sqlite3_malloc64(nByte);
  if( p==0 ){
    rc = SQLITE_NOMEM;
    goto fts3_init_out;
  }
  memset(p, 0, nByte);
  p->db = db;
  p->nColumn = nCol;
  p->nPendingData = 0;
  p->azColumn = (char **)&p[1];
  p->pTokenizer = pTokenizer;
  p->nMaxPendingData = FTS3_MAX_PENDING_DATA;
  p->bHasDocsize = (isFts4 && bNoDocsize==0);
  p->bHasStat = (u8)isFts4;
  p->bFts4 = (u8)isFts4;
  p->bDescIdx = (u8)bDescIdx;
  p->nAutoincrmerge = 0xff;   /* 0xff means setting unknown */
  p->zContentTbl = zContent;
  p->zLanguageid = zLanguageid;
  zContent = 0;
  zLanguageid = 0;
  TESTONLY( p->inTransaction = -1 );
  TESTONLY( p->mxSavepoint = -1 );

  p->aIndex = (struct Fts3Index *)&p->azColumn[nCol];
  memcpy(p->aIndex, aIndex, sizeof(struct Fts3Index) * nIndex);
  p->nIndex = nIndex;
  for(i=0; i<nIndex; i++){
    fts3HashInit(&p->aIndex[i].hPending, FTS3_HASH_STRING, 1);
  }
  p->abNotindexed = (u8 *)&p->aIndex[nIndex];

  /* Fill in the zName and zDb fields of the vtab structure. */
  zCsr = (char *)&p->abNotindexed[nCol];
  p->zName = zCsr;
  memcpy(zCsr, argv[2], nName);
  zCsr += nName;
  p->zDb = zCsr;
  memcpy(zCsr, argv[1], nDb);
  zCsr += nDb;

  /* Fill in the azColumn array */
  for(iCol=0; iCol<nCol; iCol++){
    char *z; 
    int n = 0;
    z = (char *)sqlite3Fts3NextToken(aCol[iCol], &n);
    if( n>0 ){
      memcpy(zCsr, z, n);
    }
    zCsr[n] = '\0';
    sqlite3Fts3Dequote(zCsr);
    p->azColumn[iCol] = zCsr;
    zCsr += n+1;
    assert( zCsr <= &((char *)p)[nByte] );
  }

  /* Fill in the abNotindexed array */
  for(iCol=0; iCol<nCol; iCol++){
    int n = (int)strlen(p->azColumn[iCol]);
    for(i=0; i<nNotindexed; i++){
      char *zNot = azNotindexed[i];
      if( zNot && n==(int)strlen(zNot)
       && 0==sqlite3_strnicmp(p->azColumn[iCol], zNot, n) 
      ){
        p->abNotindexed[iCol] = 1;
        sqlite3_free(zNot);
        azNotindexed[i] = 0;
      }
    }
  }
  for(i=0; i<nNotindexed; i++){
    if( azNotindexed[i] ){
      sqlite3Fts3ErrMsg(pzErr, "no such column: %s", azNotindexed[i]);
      rc = SQLITE_ERROR;
    }
  }

  if( rc==SQLITE_OK && (zCompress==0)!=(zUncompress==0) ){
    char const *zMiss = (zCompress==0 ? "compress" : "uncompress");
    rc = SQLITE_ERROR;
    sqlite3Fts3ErrMsg(pzErr, "missing %s parameter in fts4 constructor", zMiss);
  }
  p->zReadExprlist = fts3ReadExprList(p, zUncompress, &rc);
  p->zWriteExprlist = fts3WriteExprList(p, zCompress, &rc);
  if( rc!=SQLITE_OK ) goto fts3_init_out;

  /* If this is an xCreate call, create the underlying tables in the 
  ** database. TODO: For xConnect(), it could verify that said tables exist.
  */
  if( isCreate ){
    rc = fts3CreateTables(p);
  }

  /* Check to see if a legacy fts3 table has been "upgraded" by the
  ** addition of a %_stat table so that it can use incremental merge.
  */
  if( !isFts4 && !isCreate ){
    p->bHasStat = 2;
  }

  /* Figure out the page-size for the database. This is required in order to
  ** estimate the cost of loading large doclists from the database.  */
  fts3DatabasePageSize(&rc, p);
  p->nNodeSize = p->nPgsz-35;

  /* Declare the table schema to SQLite. */
  fts3DeclareVtab(&rc, p);

fts3_init_out:
  sqlite3_free(zPrefix);
  sqlite3_free(aIndex);
  sqlite3_free(zCompress);
  sqlite3_free(zUncompress);
  sqlite3_free(zContent);
  sqlite3_free(zLanguageid);
  for(i=0; i<nNotindexed; i++) sqlite3_free(azNotindexed[i]);
  sqlite3_free((void *)aCol);
  sqlite3_free((void *)azNotindexed);
  if( rc!=SQLITE_OK ){
    if( p ){
      fts3DisconnectMethod((sqlite3_vtab *)p);
    }else if( pTokenizer ){
      pTokenizer->pModule->xDestroy(pTokenizer);
    }
  }else{
    assert( p->pSegments==0 );
    *ppVTab = &p->base;
  }
  return rc;
}